

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Action_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::IO_Action_PDU::SetStandardVariableRecords
          (IO_Action_PDU *this,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
          *SVR)

{
  KUINT16 *pKVar1;
  pointer pKVar2;
  KUINT16 KVar3;
  pointer pKVar4;
  
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
  ::operator=(&this->m_vStdVarRecs,SVR);
  (this->super_IO_Header).super_Header.super_Header6.m_ui16PDULength = 0x38;
  pKVar2 = (this->m_vStdVarRecs).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar4 = (this->m_vStdVarRecs).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar4 != pKVar2; pKVar4 = pKVar4 + 1) {
    KVar3 = DATA_TYPE::StandardVariable::GetRecordLength(pKVar4->m_pRef);
    pKVar1 = &(this->super_IO_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + KVar3;
  }
  this->m_ui16NumStdVarRec =
       (short)((uint)(*(int *)&(this->m_vStdVarRecs).
                               super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                     *(int *)&(this->m_vStdVarRecs).
                              super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x5555;
  return;
}

Assistant:

void IO_Action_PDU::SetStandardVariableRecords( const vector<StdVarPtr> & SVR )
{
    m_vStdVarRecs = SVR;

    // Reset the PDU length.
    m_ui16PDULength = IO_ACTION_PDU_SIZE;

    // Calculate the new pdu length.
    KUINT16 ui16Length = 0;
    vector<StdVarPtr>::const_iterator citr = m_vStdVarRecs.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vStdVarRecs.end();
    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength += ( *citr )->GetRecordLength();
    }

    m_ui16NumStdVarRec = m_vStdVarRecs.size();
}